

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Bucket __thiscall
QHashPrivate::
Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>::
findBucketWithHash<QtPrivate::QModelIndexWrapper>
          (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
           *this,QModelIndexWrapper *key,size_t hash)

{
  Span *pSVar1;
  Entry *pEVar2;
  Span *pSVar3;
  ulong uVar4;
  byte bVar5;
  Bucket BVar6;
  
  pSVar1 = this->spans;
  uVar4 = this->numBuckets - 1 & hash;
  pSVar3 = pSVar1 + (uVar4 >> 7);
  uVar4 = (ulong)((uint)uVar4 & 0x7f);
  bVar5 = pSVar3->offsets[uVar4];
  if (bVar5 != 0xff) {
    do {
      pEVar2 = pSVar3->entries;
      if ((((*(int *)&pEVar2[bVar5].storage == (key->index).r) &&
           (*(int *)&pEVar2[bVar5].storage.field_0x4 == (key->index).c)) &&
          (*(quintptr *)&pEVar2[bVar5].storage.field_0x8 == (key->index).i)) &&
         (*(QAbstractItemModel **)&pEVar2[bVar5].storage.field_0x10 == (key->index).m.ptr)) break;
      uVar4 = uVar4 + 1;
      if (uVar4 == 0x80) {
        pSVar3 = pSVar3 + 1;
        if (((long)pSVar3 - (long)pSVar1 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7) == 0)
        {
          pSVar3 = pSVar1;
        }
        uVar4 = 0;
      }
      bVar5 = pSVar3->offsets[uVar4];
    } while (bVar5 != 0xff);
  }
  BVar6.index = uVar4;
  BVar6.span = pSVar3;
  return BVar6;
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }